

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_write_val_anchor(Parser *this,size_t node_id)

{
  Tree *pTVar1;
  NodeType_e NVar2;
  code *pcVar3;
  csubstr ref;
  bool bVar4;
  csubstr *pcVar5;
  size_t sVar6;
  Tree *this_00;
  char *pcVar7;
  basic_substring<const_char> local_58;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  if ((this->m_val_anchor).str != (char *)0x0 && (this->m_val_anchor).len != 0) {
    Tree::set_val_anchor(this->m_tree,node_id,this->m_val_anchor);
    (this->m_val_anchor).str = (char *)0x0;
    (this->m_val_anchor).len = 0;
  }
  pTVar1 = this->m_tree;
  if ((node_id == 0xffffffffffffffff) || (this_00 = pTVar1, pTVar1->m_cap <= node_id)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_58.str._0_4_ = 0;
    local_58.str._4_4_ = 0;
    local_58.len._0_4_ = 0x4b86;
    local_58.len._4_4_ = 0;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    this_00 = this->m_tree;
  }
  if ((pTVar1->m_buf[node_id].m_type.type & VAL) == NOTYPE) {
    pcVar7 = "";
    sVar6 = 0;
  }
  else {
    pcVar5 = Tree::val(this_00,node_id);
    pcVar7 = pcVar5->str;
    sVar6 = pcVar5->len;
    this_00 = this->m_tree;
  }
  if ((node_id == 0xffffffffffffffff) || (this_00->m_cap <= node_id)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    local_58.str._0_4_ = 0;
    local_58.str._4_4_ = 0;
    local_58.len._0_4_ = 0x4b86;
    local_58.len._4_4_ = 0;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((((~(int)this_00->m_buf[node_id].m_type.type & 0x1001U) != 0) && (sVar6 != 0)) &&
     (*pcVar7 == '*')) {
    pTVar1 = this->m_tree;
    if ((node_id == 0xffffffffffffffff) || (pTVar1->m_cap <= node_id)) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar4 = is_debugger_attached();
        if (bVar4) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      local_58.str._0_4_ = 0;
      local_58.str._4_4_ = 0;
      local_58.len._0_4_ = 0x4b86;
      local_58.len._4_4_ = 0;
      local_48 = 0;
      pcStack_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_38 = 0x65;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    NVar2 = pTVar1->m_buf[node_id].m_type.type;
    if ((NVar2 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar2 >> 9 & 1) != 0) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar4 = is_debugger_attached();
        if (bVar4) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      local_58.str._0_4_ = 0;
      local_58.str._4_4_ = 0;
      local_58.len._0_4_ = 0x7715;
      local_58.len._4_4_ = 0;
      local_48 = 0;
      pcStack_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_38 = 0x65;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: !m_tree->has_val_anchor(node_id)",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pTVar1 = this->m_tree;
    basic_substring<const_char>::basic_substring(&local_58,pcVar7 + 1,sVar6 - 1);
    ref.str._4_4_ = local_58.str._4_4_;
    ref.str._0_4_ = local_58.str._0_4_;
    ref.len._0_4_ = (undefined4)local_58.len;
    ref.len._4_4_ = local_58.len._4_4_;
    Tree::set_val_ref(pTVar1,node_id,ref);
  }
  return;
}

Assistant:

void Parser::_write_val_anchor(size_t node_id)
{
    if( ! m_val_anchor.empty())
    {
        _c4dbgpf("node={}: set val anchor to '{}'", node_id, m_val_anchor);
        m_tree->set_val_anchor(node_id, m_val_anchor);
        m_val_anchor.clear();
    }
    csubstr r = m_tree->has_val(node_id) ? m_tree->val(node_id) : "";
    if(!m_tree->is_val_quoted(node_id) && r.begins_with('*'))
    {
        _c4dbgpf("node={}: set val reference: '{}'", node_id, r);
        RYML_CHECK(!m_tree->has_val_anchor(node_id));
        m_tree->set_val_ref(node_id, r.sub(1));
    }
}